

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Contacts.cc
# Opt level: O1

void __thiscall RigidBodyDynamics::ConstraintSet::clear(ConstraintSet *this)

{
  undefined8 *puVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  
  if (0 < *(long *)(this + 0x70)) {
    memset(*(void **)(this + 0x68),0,*(long *)(this + 0x70) << 3);
  }
  if (0 < *(long *)(this + 0x80)) {
    memset(*(void **)(this + 0x78),0,*(long *)(this + 0x80) << 3);
  }
  if (0 < *(long *)(this + 0x90)) {
    memset(*(void **)(this + 0x88),0,*(long *)(this + 0x90) << 3);
  }
  if (0 < *(long *)(this + 0xb8) * *(long *)(this + 0xb0)) {
    memset(*(void **)(this + 0xa8),0,*(long *)(this + 0xb8) * *(long *)(this + 0xb0) * 8);
  }
  if (0 < *(long *)(this + 200)) {
    memset(*(void **)(this + 0xc0),0,*(long *)(this + 200) << 3);
  }
  if (0 < *(long *)(this + 0xd8)) {
    memset(*(void **)(this + 0xd0),0,*(long *)(this + 0xd8) << 3);
  }
  if (0 < *(long *)(this + 0xf0) * *(long *)(this + 0xe8)) {
    memset(*(void **)(this + 0xe0),0,*(long *)(this + 0xf0) * *(long *)(this + 0xe8) * 8);
  }
  if (0 < *(long *)(this + 0x108) * *(long *)(this + 0x100)) {
    memset(*(void **)(this + 0xf8),0,*(long *)(this + 0x108) * *(long *)(this + 0x100) * 8);
  }
  if (0 < *(long *)(this + 0x118)) {
    memset(*(void **)(this + 0x110),0,*(long *)(this + 0x118) << 3);
  }
  if (0 < *(long *)(this + 0x128)) {
    memset(*(void **)(this + 0x120),0,*(long *)(this + 0x128) << 3);
  }
  if (0 < *(long *)(this + 0x1e8) * *(long *)(this + 0x1e0)) {
    memset(*(void **)(this + 0x1d8),0,*(long *)(this + 0x1e8) * *(long *)(this + 0x1e0) * 8);
  }
  if (0 < *(long *)(this + 0x1f8)) {
    memset(*(void **)(this + 0x1f0),0,*(long *)(this + 0x1f8) << 3);
  }
  if (0 < *(long *)(this + 0x208)) {
    memset(*(void **)(this + 0x200),0,*(long *)(this + 0x208) << 3);
  }
  if (0 < *(long *)(this + 0x218)) {
    memset(*(void **)(this + 0x210),0,*(long *)(this + 0x218) << 3);
  }
  lVar2 = *(long *)(this + 0x220);
  if (*(long *)(this + 0x228) - lVar2 != 0) {
    uVar4 = (*(long *)(this + 0x228) - lVar2 >> 4) * -0x5555555555555555;
    uVar5 = 1;
    uVar7 = 0;
    do {
      uVar6 = uVar5;
      lVar8 = uVar7 * 0x30;
      puVar1 = (undefined8 *)(lVar2 + 0x20 + lVar8);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)(lVar2 + 0x10 + lVar8);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)(lVar2 + lVar8) = 0;
      ((undefined8 *)(lVar2 + lVar8))[1] = 0;
      uVar5 = (ulong)((int)uVar6 + 1);
      uVar7 = uVar6;
    } while (uVar6 <= uVar4 && uVar4 - uVar6 != 0);
  }
  lVar2 = *(long *)(this + 0x238);
  if (*(long *)(this + 0x240) - lVar2 != 0) {
    uVar4 = (*(long *)(this + 0x240) - lVar2 >> 4) * -0x5555555555555555;
    uVar5 = 1;
    uVar7 = 0;
    do {
      uVar6 = uVar5;
      lVar8 = uVar7 * 0x30;
      puVar1 = (undefined8 *)(lVar2 + 0x20 + lVar8);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)(lVar2 + 0x10 + lVar8);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)(lVar2 + lVar8) = 0;
      ((undefined8 *)(lVar2 + lVar8))[1] = 0;
      uVar5 = (ulong)((int)uVar6 + 1);
      uVar7 = uVar6;
    } while (uVar6 <= uVar4 && uVar4 - uVar6 != 0);
  }
  lVar2 = *(long *)(this + 0x250);
  if (*(long *)(this + 600) - lVar2 != 0) {
    uVar4 = (*(long *)(this + 600) - lVar2 >> 3) * -0x5555555555555555;
    uVar5 = 1;
    uVar7 = 0;
    do {
      uVar6 = uVar5;
      puVar1 = (undefined8 *)(lVar2 + uVar7 * 0x18);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)(lVar2 + 0x10 + uVar7 * 0x18) = 0;
      uVar5 = (ulong)((int)uVar6 + 1);
      uVar7 = uVar6;
    } while (uVar6 <= uVar4 && uVar4 - uVar6 != 0);
  }
  lVar2 = *(long *)(this + 0x268);
  if (*(long *)(this + 0x270) - lVar2 != 0) {
    uVar4 = (*(long *)(this + 0x270) - lVar2 >> 4) * -0x5555555555555555;
    uVar5 = 1;
    uVar7 = 0;
    do {
      uVar6 = uVar5;
      lVar8 = uVar7 * 0x30;
      puVar1 = (undefined8 *)(lVar2 + 0x20 + lVar8);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)(lVar2 + 0x10 + lVar8);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)(lVar2 + lVar8) = 0;
      ((undefined8 *)(lVar2 + lVar8))[1] = 0;
      uVar5 = (ulong)((int)uVar6 + 1);
      uVar7 = uVar6;
    } while (uVar6 <= uVar4 && uVar4 - uVar6 != 0);
  }
  lVar2 = *(long *)(this + 0x280);
  if (*(long *)(this + 0x288) - lVar2 != 0) {
    uVar5 = (*(long *)(this + 0x288) - lVar2 >> 4) * -0x5555555555555555;
    uVar3 = 1;
    uVar7 = 0;
    do {
      lVar8 = uVar7 * 0x30;
      puVar1 = (undefined8 *)(lVar2 + 0x20 + lVar8);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)(lVar2 + 0x10 + lVar8);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)(lVar2 + lVar8) = 0;
      ((undefined8 *)(lVar2 + lVar8))[1] = 0;
      uVar7 = (ulong)uVar3;
      uVar3 = uVar3 + 1;
    } while (uVar7 <= uVar5 && uVar5 - uVar7 != 0);
  }
  if (0 < *(long *)(this + 0x2a0)) {
    memset(*(void **)(this + 0x298),0,*(long *)(this + 0x2a0) << 3);
    return;
  }
  return;
}

Assistant:

void ConstraintSet::clear() {
	acceleration.setZero();
	force.setZero();
	impulse.setZero();

	H.setZero();
	C.setZero();
	gamma.setZero();
	G.setZero();
	A.setZero();
	b.setZero();
	x.setZero();

	K.setZero();
	a.setZero();
	QDDot_t.setZero();
	QDDot_0.setZero();

	unsigned int i;
	for (i = 0; i < f_t.size(); i++)
		f_t[i].setZero();

	for (i = 0; i < f_ext_constraints.size(); i++)
		f_ext_constraints[i].setZero();

	for (i = 0; i < point_accel_0.size(); i++)
		point_accel_0[i].setZero();

	for (i = 0; i < d_pA.size(); i++)
		d_pA[i].setZero();

	for (i = 0; i < d_a.size(); i++)
		d_a[i].setZero();

	d_u.setZero();
}